

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_create_flags2
          (Impl *this,Value *state,VkPipelineCreateFlags2CreateInfoKHR **flags2)

{
  VkPipelineCreateFlags2CreateInfo *pVVar1;
  Type this_00;
  uint64_t uVar2;
  VkPipelineCreateFlags2CreateInfo *info;
  VkPipelineCreateFlags2CreateInfoKHR **flags2_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar1 = ScratchAllocator::allocate_cleared<VkPipelineCreateFlags2CreateInfo>(&this->allocator);
  *flags2 = pVVar1;
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)state,"flags");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint64(this_00);
  pVVar1->flags = uVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_create_flags2(const Value &state,
                                                       VkPipelineCreateFlags2CreateInfoKHR **flags2)
{
	auto *info = allocator.allocate_cleared<VkPipelineCreateFlags2CreateInfoKHR>();
	*flags2 = info;
	info->flags = state["flags"].GetUint64();
	return true;
}